

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_rectangle<unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int x1,int y1,int z1,uchar *color,
          float opacity)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  bool bVar6;
  CImgArgumentException *this_00;
  char *pcVar7;
  char *pcVar8;
  CImg<unsigned_char> *in_RDI;
  long in_stack_00000010;
  float in_stack_00000050;
  int in_stack_00000054;
  int in_stack_00000058;
  int in_stack_0000005c;
  int c;
  int in_stack_00000064;
  CImg<unsigned_char> *in_stack_00000068;
  int in_stack_00000090;
  uchar in_stack_00000098;
  int local_48;
  
  if (in_stack_00000010 != 0) {
    bVar6 = is_empty(in_RDI);
    if (!bVar6) {
      for (local_48 = 0; local_48 < (int)in_RDI->_spectrum; local_48 = local_48 + 1) {
        draw_rectangle(in_stack_00000068,in_stack_00000064,c,in_stack_0000005c,in_stack_00000058,
                       in_stack_00000054,y0,(int)this,in_stack_00000090,in_stack_00000098,
                       in_stack_00000050);
      }
    }
    return in_RDI;
  }
  this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
  uVar1 = in_RDI->_width;
  uVar2 = in_RDI->_height;
  uVar3 = in_RDI->_depth;
  uVar4 = in_RDI->_spectrum;
  puVar5 = in_RDI->_data;
  pcVar7 = "non-";
  if ((in_RDI->_is_shared & 1U) != 0) {
    pcVar7 = "";
  }
  pcVar8 = pixel_type();
  CImgArgumentException::CImgArgumentException
            (this_00,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_rectangle : Specified color is (null)."
             ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8);
  __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgArgumentException::~CImgArgumentException
             );
}

Assistant:

CImg<T>& draw_rectangle(const int x0, const int y0, const int z0,
                            const int x1, const int y1, const int z1,
                            const tc *const color, const float opacity=1) {
      if (!color)
        throw CImgArgumentException(_cimg_instance
                                    "draw_rectangle : Specified color is (null).",
                                    cimg_instance);

      if (is_empty()) return *this;
      cimg_forC(*this,c) draw_rectangle(x0,y0,z0,c,x1,y1,z1,c,color[c],opacity);
      return *this;
    }